

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_push_response_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_frame *in_RDX;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  int rv;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  if (*(int *)((long)in_RDX + 0xcc) != 4) {
    __assert_fail("stream->state == NGHTTP2_STREAM_RESERVED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x10d9,
                  "int nghttp2_session_on_push_response_headers_received(nghttp2_session *, nghttp2_frame *, nghttp2_stream *)"
                 );
  }
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  if (*(int *)&(in_RSI->streams).mem == 0) {
    iVar2 = session_inflate_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,iVar1,
                       (char *)in_RDX);
  }
  else if (*(char *)((long)in_RDI + 0xb74) == '\0') {
    iVar1 = session_is_incoming_concurrent_streams_max((nghttp2_session *)&in_RDI->hd);
    if (iVar1 == 0) {
      iVar1 = session_allow_incoming_new_stream((nghttp2_session *)&in_RDI->hd);
      if (iVar1 == 0) {
        iVar2 = -0x67;
      }
      else {
        iVar1 = session_is_incoming_concurrent_streams_pending_max((nghttp2_session *)&in_RDI->hd);
        if (iVar1 == 0) {
          nghttp2_stream_promise_fulfilled((nghttp2_stream *)&in_RDX->hd);
          iVar2 = nghttp2_session_is_my_stream_id
                            ((nghttp2_session *)&in_RDI->hd,*(int32_t *)((long)in_RDX + 0xa8));
          if (iVar2 == 0) {
            *(long *)((long)in_RDI + 0xa98) = *(long *)((long)in_RDI + 0xa98) + -1;
          }
          *(long *)((long)in_RDI + 0xa90) = *(long *)((long)in_RDI + 0xa90) + 1;
          iVar2 = session_call_on_begin_headers(in_RSI,in_RDX);
          if (iVar2 == 0) {
            iVar2 = 0;
          }
        }
        else {
          iVar2 = session_inflate_handle_invalid_stream(in_RSI,in_RDX,iVar2);
        }
      }
    }
    else {
      iVar2 = session_inflate_handle_invalid_connection
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (int)((ulong)in_RSI >> 0x20),(char *)in_RDX);
    }
  }
  else {
    iVar2 = session_inflate_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,iVar1,
                       (char *)in_RDX);
  }
  return iVar2;
}

Assistant:

int nghttp2_session_on_push_response_headers_received(nghttp2_session *session,
                                                      nghttp2_frame *frame,
                                                      nghttp2_stream *stream) {
  int rv = 0;
  assert(stream->state == NGHTTP2_STREAM_RESERVED);
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO,
      "push response HEADERS: stream_id == 0");
  }

  if (session->server) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO,
      "HEADERS: no HEADERS allowed from client in reserved state");
  }

  if (session_is_incoming_concurrent_streams_max(session)) {
    return session_inflate_handle_invalid_connection(
      session, frame, NGHTTP2_ERR_PROTO,
      "push response HEADERS: max concurrent streams exceeded");
  }

  if (!session_allow_incoming_new_stream(session)) {
    /* We don't accept new stream after GOAWAY was sent. */
    return NGHTTP2_ERR_IGN_HEADER_BLOCK;
  }

  if (session_is_incoming_concurrent_streams_pending_max(session)) {
    return session_inflate_handle_invalid_stream(session, frame,
                                                 NGHTTP2_ERR_REFUSED_STREAM);
  }

  nghttp2_stream_promise_fulfilled(stream);
  if (!nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
    --session->num_incoming_reserved_streams;
  }
  ++session->num_incoming_streams;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}